

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::toSdf(Image *__return_storage_ptr__,Mesh *_mesh,float _paddingPct,int _resolution)

{
  BoundingBox *this;
  double dVar1;
  double dVar2;
  pointer ptVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  thread *t_1;
  pointer ptVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  vec3 vVar13;
  long *local_1b0;
  int local_1a8;
  int local_1a4;
  thread t;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vec<3,_float,_(glm::qualifier)0> local_168;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> tris;
  BVH acc;
  Mesh mesh;
  
  Mesh::Mesh(&mesh,_mesh);
  center(&mesh.m_vertices);
  Mesh::getTriangles(&tris,&mesh);
  BVH::BVH(&acc,&tris,SPLIT_MIDPOINT);
  this = &acc.super_BoundingBox;
  BoundingBox::square(this);
  vVar13 = BoundingBox::getDiagonal(this);
  local_168.field_2 = vVar13.field_2;
  local_168._0_8_ = vVar13._0_8_;
  fVar12 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_168);
  BoundingBox::expand(this,fVar12 * fVar12 * _paddingPct);
  dVar1 = ldexp(1.0,_resolution);
  dVar2 = (double)(int)dVar1;
  if (dVar2 < 0.0) {
    dVar2 = ::sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  Image::Image(__return_storage_ptr__);
  iVar6 = (int)dVar1;
  local_1a4 = (int)dVar2;
  Image::allocate(__return_storage_ptr__,(long)(local_1a4 * iVar6),(long)(local_1a4 * iVar6),1);
  iVar4 = std::thread::hardware_concurrency();
  local_1a8 = iVar6 % iVar4;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar11 = iVar4;
  if (iVar4 < 1) {
    iVar11 = 0;
  }
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar10 = 0;
  for (iVar8 = 0;
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,
      ptVar7 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, iVar11 != iVar8; iVar8 = iVar8 + 1) {
    t._M_id._M_thread = (id)0;
    local_1b0 = (long *)operator_new(0x40);
    iVar5 = 0;
    if (iVar4 + -1 == iVar8) {
      iVar5 = local_1a8;
    }
    iVar9 = iVar6 / iVar4 + iVar10;
    *local_1b0 = (long)&PTR___State_003de490;
    local_1b0[1] = (long)&acc;
    local_1b0[2] = (long)__return_storage_ptr__;
    *(int *)(local_1b0 + 3) = iVar10;
    *(int *)((long)local_1b0 + 0x1c) = iVar5 + iVar9;
    *(int *)(local_1b0 + 4) = iVar6;
    *(float *)((long)local_1b0 + 0x24) = 1.0 / (float)(int)dVar1;
    *(int *)(local_1b0 + 5) = local_1a4;
    *(undefined8 *)((long)local_1b0 + 0x2c) = local_168._0_8_;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)((long)local_1b0 + 0x34) =
         local_168.field_2;
    *(float *)(local_1b0 + 7) = fVar12 * 0.5;
    std::thread::_M_start_thread(&t,&local_1b0,0);
    if (local_1b0 != (long *)0x0) {
      (**(code **)(*local_1b0 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>(&threads,&t);
    std::thread::~thread(&t);
    iVar10 = iVar9;
  }
  for (; ptVar7 != ptVar3; ptVar7 = ptVar7 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  BVH::~BVH(&acc);
  std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(&tris);
  Mesh::~Mesh(&mesh);
  return __return_storage_ptr__;
}

Assistant:

Image   toSdf(const Mesh& _mesh, float _paddingPct, int _resolution) {
    Mesh mesh = _mesh;
    center(mesh);
    std::vector<Triangle> tris = mesh.getTriangles();
    BVH acc(tris, vera::SPLIT_MIDPOINT);

    acc.square();

    glm::vec3   bdiagonal   = acc.getDiagonal();
    float       max_dist    = glm::length(bdiagonal);
    acc.expand( (max_dist*max_dist) * _paddingPct );

    int    voxel_resolution = std::pow(2, _resolution);
    float        voxel_size = 1.0/float(voxel_resolution);
    int         layersTotal = std::sqrt(voxel_resolution);
    int    image_resolution = voxel_resolution * layersTotal;

    Image rta;
    rta.allocate(image_resolution, image_resolution, 1);

    const int nThreads  = std::thread::hardware_concurrency();
    int layersPerThread = voxel_resolution / nThreads;
    int layersLeftOver  = voxel_resolution % nThreads;
    max_dist *= 0.5f;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_layer = i * layersPerThread;
        int end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&acc, &rta, start_layer, end_layer, voxel_resolution, voxel_size, layersTotal, bdiagonal, max_dist ]() {
                for (int z = start_layer; z < end_layer; z++)
                for (int y = 0; y < voxel_resolution; y++)
                for (int x = 0; x < voxel_resolution; x++) {
                    // for each voxel convert it into a point in the space containing a mesh
                    glm::vec3 p = glm::vec3(x, y, z) * voxel_size;
                    p = acc.min + p * bdiagonal;

                    glm::vec4 c = acc.getClosestRGBSignedDistance(p);
                    c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;

                    size_t layerX = (z % layersTotal) * voxel_resolution; 
                    size_t layerY = floor(z / layersTotal) * voxel_resolution;
                    rta.setColor(rta.getIndex(layerX + x, layerY + y), c);
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return rta;
}